

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool ray_2D_intersect(ray_2D r1,ray_2D r2,float *t1,float *t2)

{
  mat4 m_00;
  mat4 m_01;
  vec4 vVar1;
  undefined8 in_stack_ffffffffffffff18;
  float local_d8;
  float fStack_d4;
  vec4 t_v;
  vec4 v;
  mat4 mi;
  mat4 m;
  float *t2_local;
  float *t1_local;
  ray_2D r2_local;
  ray_2D r1_local;
  
  r2_local.orig.x = r2.dir.x;
  r2_local.orig.y = r2.dir.y;
  r1_local.orig.x = r1.dir.x;
  r1_local.orig.y = r1.dir.y;
  mat4_create((mat4 *)(mi.m + 0xe),r1_local.orig.x,-r2_local.orig.x,0.0,0.0,r1_local.orig.y,
              -r2_local.orig.y,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  m_01.m[2] = m.m[2];
  m_01.m._0_8_ = m.m._0_8_;
  m_01.m[3] = m.m[3];
  m_01.m[4] = m.m[4];
  m_01.m[5] = m.m[5];
  m_01.m[6] = m.m[6];
  m_01.m[7] = m.m[7];
  m_01.m[8] = m.m[8];
  m_01.m[9] = m.m[9];
  m_01.m[10] = m.m[10];
  m_01.m[0xb] = m.m[0xb];
  m_01.m[0xc] = m.m[0xc];
  m_01.m[0xd] = m.m[0xd];
  m_01.m[0xe] = (float)(int)in_stack_ffffffffffffff18;
  m_01.m[0xf] = (float)(int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  mat4_inverse(m_01);
  t1_local._0_4_ = r2.orig.x;
  t1_local._4_4_ = r2.orig.y;
  r2_local.dir.x = r1.orig.x;
  r2_local.dir.y = r1.orig.y;
  vVar1 = vec4_create(t1_local._0_4_ - r2_local.dir.x,t1_local._4_4_ - r2_local.dir.y,0.0,0.0);
  m_00.m[2] = mi.m[0];
  m_00.m._0_8_ = v._8_8_;
  m_00.m[3] = mi.m[1];
  m_00.m[4] = mi.m[2];
  m_00.m[5] = mi.m[3];
  m_00.m[6] = mi.m[4];
  m_00.m[7] = mi.m[5];
  m_00.m[8] = mi.m[6];
  m_00.m[9] = mi.m[7];
  m_00.m[10] = mi.m[8];
  m_00.m[0xb] = mi.m[9];
  m_00.m[0xc] = mi.m[10];
  m_00.m[0xd] = mi.m[0xb];
  m_00.m[0xe] = mi.m[0xc];
  m_00.m[0xf] = mi.m[0xd];
  vVar1 = vec4_apply_mat(vVar1,m_00);
  local_d8 = vVar1.x;
  *t1 = local_d8;
  fStack_d4 = vVar1.y;
  *t2 = fStack_d4;
  return true;
}

Assistant:

bool ray_2D_intersect(struct ray_2D r1, struct ray_2D r2, float *t1, float *t2) {
    mat4 m = mat4_create(r1.dir.x, -r2.dir.x, 0.0f, 0.0f,
            r1.dir.y, -r2.dir.y, 0.0f, 0.0f,
            0.0f, 0.0f, 1.0f, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
    mat4 mi = mat4_inverse(m);
    vec4 v = vec4_create(r2.orig.x - r1.orig.x, r2.orig.y - r1.orig.y, 0.0f, 0.0f);
    vec4 t_v = vec4_apply_mat(v, mi);
    *t1 = t_v.x;
    *t2 = t_v.y;
    return true;
}